

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickpool.hpp
# Opt level: O0

void __thiscall quickpool::sched::TaskManager::wait_for_jobs(TaskManager *this,size_t id)

{
  bool bVar1;
  __int_type_conflict _Var2;
  size_type sVar3;
  reference this_00;
  lock_guard<std::mutex> __stat_loc;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lk;
  size_t id_local;
  TaskManager *this_local;
  
  lk._M_device = (mutex_type *)id;
  bVar1 = has_errored(this);
  if (bVar1) {
    std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mtx_);
    _Var2 = std::__atomic_base<unsigned_long>::operator++
                      ((__atomic_base<unsigned_long> *)&this->num_waiting_);
    sVar3 = std::
            vector<quickpool::sched::TaskQueue,_quickpool::mem::aligned::allocator<quickpool::sched::TaskQueue,_64UL>_>
            ::size(&this->queues_);
    if (_Var2 == sVar3) {
      std::condition_variable::notify_all();
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
  }
  else {
    std::__atomic_base<unsigned_long>::operator++
              ((__atomic_base<unsigned_long> *)&this->num_waiting_);
  }
  __stat_loc._M_device = lk._M_device;
  this_00 = std::
            vector<quickpool::sched::TaskQueue,_quickpool::mem::aligned::allocator<quickpool::sched::TaskQueue,_64UL>_>
            ::operator[](&this->queues_,(size_type)lk._M_device);
  TaskQueue::wait(this_00,__stat_loc._M_device);
  std::__atomic_base<unsigned_long>::operator--((__atomic_base<unsigned_long> *)&this->num_waiting_)
  ;
  return;
}

Assistant:

void wait_for_jobs(size_t id)
    {
        if (has_errored()) {
            // Main thread may be waiting to reset the pool.
            std::lock_guard<std::mutex> lk(mtx_);
            if (++num_waiting_ == queues_.size())
                cv_.notify_all();
        } else {
            ++num_waiting_;
        }

        queues_[id].wait();
        --num_waiting_;
    }